

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

void __thiscall
duckdb::RangeInfoStruct<duckdb::NumericRangeInfo,_true>::~RangeInfoStruct
          (RangeInfoStruct<duckdb::NumericRangeInfo,_true> *this)

{
  long lVar1;
  
  lVar1 = 0x98;
  do {
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)((long)this->vdata + lVar1 + -8));
    lVar1 = lVar1 + -0x48;
  } while (lVar1 != -0x40);
  return;
}

Assistant:

explicit RangeInfoStruct(DataChunk &args_p) : args(args_p) {
		switch (args.ColumnCount()) {
		case 1:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			break;
		case 2:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			break;
		case 3:
			args.data[0].ToUnifiedFormat(args.size(), vdata[0]);
			args.data[1].ToUnifiedFormat(args.size(), vdata[1]);
			args.data[2].ToUnifiedFormat(args.size(), vdata[2]);
			break;
		default:
			throw InternalException("Unsupported number of parameters for range");
		}
	}